

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

BBox3fa * __thiscall
embree::avx::PointsISA::vbounds(BBox3fa *__return_storage_ptr__,PointsISA *this,size_t i)

{
  undefined1 auVar1 [16];
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  lVar2 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
  lVar4 = i * *(long *)&(this->super_Points).field_0x68;
  auVar1 = *(undefined1 (*) [16])(lVar2 + lVar4);
  auVar5 = ZEXT416((uint)(*(float *)(lVar2 + 0xc + lVar4) * (this->super_Points).maxRadiusScale));
  auVar5 = vshufps_avx(auVar5,auVar5,0);
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar1,auVar5);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar1._0_4_ + auVar5._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar1._4_4_ + auVar5._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar1._8_4_ + auVar5._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar1._12_4_ + auVar5._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const
      {
        return bounds(i);
      }